

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O1

int Nwk_ManPushBackwardBot_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  int iVar2;
  Nwk_Obj_t *pObj_00;
  int iVar3;
  
  iVar1 = pObj->TravId;
  iVar2 = pObj->pMan->nTravIds;
  iVar3 = iVar2 + -2;
  if (iVar1 == iVar2 || iVar1 == iVar3) {
    return 0;
  }
  if ((iVar3 <= iVar1) && (iVar3 = iVar2, iVar1 != iVar2 + -1)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFlow.c"
                  ,0x49,"void Nwk_ObjSetVisitedBot(Nwk_Obj_t *)");
  }
  pObj->TravId = iVar3;
  if ((pObj->field_0x20 & 0x20) == 0) {
    iVar3 = Nwk_ManPushBackwardTop_rec(pObj,pObj);
    if (iVar3 == 0) {
      return 0;
    }
    pObj->field_0x20 = pObj->field_0x20 | 0x20;
  }
  else {
    pObj_00 = (Nwk_Obj_t *)pObj->pCopy;
    if (pObj_00 == (Nwk_Obj_t *)0x0) {
      return 0;
    }
    iVar3 = Nwk_ManPushBackwardTop_rec(pObj_00,pObj_00);
    if (iVar3 == 0) {
      return 0;
    }
  }
  pObj->pCopy = pPred;
  return 1;
}

Assistant:

int Nwk_ManPushBackwardBot_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    if ( Nwk_ObjVisitedBot(pObj) )
        return 0;
    Nwk_ObjSetVisitedBot(pObj);
    // propagate through the internal edge
    if ( Nwk_ObjHasFlow(pObj) )
    {
        if ( Nwk_ObjPred(pObj) )
            if ( Nwk_ManPushBackwardTop_rec( Nwk_ObjPred(pObj), Nwk_ObjPred(pObj) ) )
                return Nwk_ObjSetPred( pObj, pPred ); 
    }
    else if ( Nwk_ManPushBackwardTop_rec(pObj, pObj) )
    {
        Nwk_ObjSetFlow( pObj );
        return Nwk_ObjSetPred( pObj, pPred );
    }
    return 0;
}